

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O1

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item*,std::vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,double>::item>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (double *__result,double *__a,double *__b,double *__c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar7 = (double)*(int *)(__a + 2);
  dVar6 = *__a / dVar7;
  dVar1 = *__b;
  if (dVar1 / dVar7 <= dVar6) {
    if (*__c / dVar7 <= dVar6) {
      if (dVar1 / (double)*(int *)(__b + 2) < *__c / (double)*(int *)(__b + 2)) goto LAB_0055f7a7;
      goto LAB_0055f7c7;
    }
  }
  else {
    if (dVar1 / (double)*(int *)(__b + 2) < *__c / (double)*(int *)(__b + 2)) {
LAB_0055f7c7:
      dVar1 = *__result;
      dVar6 = __result[1];
      dVar7 = __result[2];
      dVar2 = __result[3];
      dVar3 = __b[1];
      dVar4 = __b[2];
      dVar5 = __b[3];
      *__result = *__b;
      __result[1] = dVar3;
      __result[2] = dVar4;
      __result[3] = dVar5;
      *__b = dVar1;
      __b[1] = dVar6;
      __b[2] = dVar7;
      __b[3] = dVar2;
      return;
    }
    if (dVar6 < *__c / dVar7) {
LAB_0055f7a7:
      dVar1 = *__result;
      dVar6 = __result[1];
      dVar7 = __result[2];
      dVar2 = __result[3];
      dVar3 = __c[1];
      dVar4 = __c[2];
      dVar5 = __c[3];
      *__result = *__c;
      __result[1] = dVar3;
      __result[2] = dVar4;
      __result[3] = dVar5;
      *__c = dVar1;
      __c[1] = dVar6;
      __c[2] = dVar7;
      __c[3] = dVar2;
      return;
    }
  }
  dVar1 = *__result;
  dVar6 = __result[1];
  dVar7 = __result[2];
  dVar2 = __result[3];
  dVar3 = __a[1];
  dVar4 = __a[2];
  dVar5 = __a[3];
  *__result = *__a;
  __result[1] = dVar3;
  __result[2] = dVar4;
  __result[3] = dVar5;
  *__a = dVar1;
  __a[1] = dVar6;
  __a[2] = dVar7;
  __a[3] = dVar2;
  return;
}

Assistant:

constexpr bool operator<(const item& other) const noexcept
        {
            if constexpr (std::is_same_v<Mode, minimize_tag>)
                return (r / static_cast<Float>(factor)) <
                       (other.r / static_cast<Float>(factor));
            else
                return (other.r / static_cast<Float>(factor)) <
                       (r / static_cast<Float>(factor));
        }